

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

int __thiscall ghc::filesystem::path::compare(path *this,string_type *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  path local_38;
  
  pcVar3 = (s->_M_dataplus)._M_p;
  paVar1 = &local_38._path.field_2;
  local_38._path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_38,pcVar3,pcVar3 + s->_M_string_length);
  postprocess_path_with_format(&local_38,(format)pcVar3);
  iVar2 = compare(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._path._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._path._M_dataplus._M_p,local_38._path.field_2._M_allocated_capacity + 1
                   );
  }
  return iVar2;
}

Assistant:

GHC_INLINE int path::compare(const string_type& s) const
{
    return compare(path(s));
}